

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopm.c
# Opt level: O0

void OPM_DoTimerB(opm_t *chip)

{
  ushort local_12;
  uint16_t value;
  opm_t *chip_local;
  
  local_12 = chip->timer_b_val + (ushort)chip->timer_b_inc;
  chip->timer_b_of = (byte)(local_12 >> 8) & 1;
  if (chip->timer_b_do_reset != '\0') {
    local_12 = 0;
  }
  if (chip->timer_b_do_load != '\0') {
    local_12 = (ushort)chip->timer_b_reg;
  }
  chip->timer_b_val = local_12 & 0xff;
  if (chip->cycles == 0) {
    chip->timer_b_sub = chip->timer_b_sub + '\x01';
  }
  chip->timer_b_sub_of = (byte)((int)(uint)chip->timer_b_sub >> 4) & 1;
  chip->timer_b_sub = chip->timer_b_sub & 0xf;
  if (chip->ic != '\0') {
    chip->timer_b_sub = '\0';
  }
  return;
}

Assistant:

static void OPM_DoTimerB(opm_t *chip)
{
    uint16_t value = chip->timer_b_val;
    value += chip->timer_b_inc;
    chip->timer_b_of = (value >> 8) & 1;
    if (chip->timer_b_do_reset)
    {
        value = 0;
    }
    if (chip->timer_b_do_load)
    {
        value = chip->timer_b_reg;
    }

    chip->timer_b_val = value & 255;

    if (chip->cycles == 0)
    {
        chip->timer_b_sub++;
    }

    chip->timer_b_sub_of = (chip->timer_b_sub >> 4) & 1;
    chip->timer_b_sub &= 15;
    if (chip->ic)
    {
        chip->timer_b_sub = 0;
    }
}